

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandPrintLib(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  float fVar3;
  double dVar4;
  uint local_38;
  int c;
  int fShort;
  int fInvOnly;
  float Gain;
  float Slew;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fInvOnly = 0;
  fShort = 0x42c80000;
  c = 0;
  local_38 = 0;
  Extra_UtilGetoptReset();
LAB_005245fd:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"SGish");
    if (iVar1 == -1) {
      if (pAbc->pLibScl == (void *)0x0) {
        fprintf((FILE *)pAbc->Err,"There is no Liberty library available.\n");
        return 1;
      }
      Abc_SclPrintCells((SC_Lib *)pAbc->pLibScl,(float)fInvOnly,(float)fShort,c,local_38);
      return 0;
    }
    switch(iVar1) {
    case 0x47:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by a floating point number.\n");
        goto LAB_005247ae;
      }
      dVar4 = atof(argv[globalUtilOptind]);
      fShort = (int)(float)dVar4;
      fVar3 = (float)fShort;
      break;
    default:
      goto LAB_005247ae;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by a floating point number.\n");
        goto LAB_005247ae;
      }
      dVar4 = atof(argv[globalUtilOptind]);
      fInvOnly = (int)(float)dVar4;
      fVar3 = (float)fInvOnly;
      break;
    case 0x68:
      goto LAB_005247ae;
    case 0x69:
      c = c ^ 1;
      goto LAB_005245fd;
    case 0x73:
      local_38 = local_38 ^ 1;
      goto LAB_005245fd;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (fVar3 <= 0.0) {
LAB_005247ae:
      fprintf((FILE *)pAbc->Err,"usage: print_lib [-SG float] [-ish]\n");
      fprintf((FILE *)pAbc->Err,"\t           prints statistics of Liberty library\n");
      fprintf((FILE *)pAbc->Err,
              "\t-S float : the slew parameter used to generate the library [default = %.2f]\n",
              (double)(float)fInvOnly);
      fprintf((FILE *)pAbc->Err,
              "\t-G float : the gain parameter used to generate the library [default = %.2f]\n",
              (double)(float)fShort);
      pcVar2 = "no";
      if (c != 0) {
        pcVar2 = "yes";
      }
      fprintf((FILE *)pAbc->Err,"\t-i       : toggle printing invs/bufs only [default = %s]\n",
              pcVar2);
      pcVar2 = "no";
      if (local_38 != 0) {
        pcVar2 = "yes";
      }
      fprintf((FILE *)pAbc->Err,"\t-s       : toggle printing in short format [default = %s]\n",
              pcVar2);
      fprintf((FILE *)pAbc->Err,"\t-h       : print the help massage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Scl_CommandPrintLib( Abc_Frame_t * pAbc, int argc, char **argv )
{
    float Slew = 0; // use library
    float Gain = 100;
    int fInvOnly = 0;
    int fShort = 0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SGish" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Slew = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Slew <= 0.0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Gain = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Gain <= 0.0 )
                goto usage;
            break;
        case 'i':
            fInvOnly ^= 1;
            break;
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        return 1;
    }

    // save current library
    Abc_SclPrintCells( (SC_Lib *)pAbc->pLibScl, Slew, Gain, fInvOnly, fShort );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: print_lib [-SG float] [-ish]\n" );
    fprintf( pAbc->Err, "\t           prints statistics of Liberty library\n" );
    fprintf( pAbc->Err, "\t-S float : the slew parameter used to generate the library [default = %.2f]\n", Slew );
    fprintf( pAbc->Err, "\t-G float : the gain parameter used to generate the library [default = %.2f]\n", Gain );
    fprintf( pAbc->Err, "\t-i       : toggle printing invs/bufs only [default = %s]\n", fInvOnly? "yes": "no" );
    fprintf( pAbc->Err, "\t-s       : toggle printing in short format [default = %s]\n", fShort? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the help massage\n" );
    return 1;
}